

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# next_combination.hpp
# Opt level: O2

bool OpenMD::
     next_combination<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *iterContainer,
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               first,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     last)

{
  const_iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var2;
  value_type *__x;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var3;
  long lVar4;
  value_type local_10;
  value_type local_8;
  
  if (first._M_current == last._M_current) {
    return false;
  }
  p_Var2 = (iterContainer->
           super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (iterContainer->
       super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var2 == __position._M_current) {
    __x = &local_8;
  }
  else {
    if (__position._M_current[-1]._M_current != last._M_current + -1) {
      __position._M_current[-1]._M_current = __position._M_current[-1]._M_current + 1;
      return true;
    }
    p_Var3 = __position._M_current + -2;
    lVar4 = (long)p_Var3 - (long)p_Var2;
    for (; (p_Var2 <= p_Var3 && (p_Var3[1]._M_current == p_Var3->_M_current + 1));
        p_Var3 = p_Var3 + -1) {
      lVar4 = lVar4 + -8;
    }
    if (-1 < lVar4) {
      pbVar1 = p_Var3->_M_current;
      p_Var3->_M_current = pbVar1 + 1;
      pbVar1 = pbVar1 + 2;
      while (p_Var3 = p_Var3 + 1,
            p_Var3 != (iterContainer->
                      super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
        p_Var3->_M_current = pbVar1;
        pbVar1 = pbVar1 + 1;
      }
      return true;
    }
    local_10._M_current = first._M_current;
    if (((long)(last._M_current + -1) - (long)first._M_current >> 5) + 1 ==
        (long)(int)((ulong)((long)__position._M_current - (long)p_Var2) >> 3)) {
      return false;
    }
    for (; p_Var2 != __position._M_current; p_Var2 = p_Var2 + 1) {
      p_Var2->_M_current = local_10._M_current;
      local_10._M_current = local_10._M_current + 1;
      __position._M_current =
           (iterContainer->
           super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    __x = &local_10;
  }
  local_8._M_current = first._M_current;
  std::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::insert(iterContainer,__position,__x);
  return true;
}

Assistant:

bool next_combination(std::vector<RandomAccessIterator>& iterContainer,
                        RandomAccessIterator first, RandomAccessIterator last) {
    if (first == last) { return false; }

    RandomAccessIterator endIter = --last;
    typename std::vector<RandomAccessIterator>::iterator i =
        iterContainer.end();

    if (iterContainer.empty()) {
      // if sequence is empty, we insert the first iterator
      iterContainer.insert(iterContainer.end(), first);
      return true;
    } else if (*(--i) != endIter) {
      // if the last iterator in iterContainer does not reaches the end, just
      // increase its iterator by 1
      ++(*i);
      return true;
    } else {  // the last iterator in iterContainer does not reaches the end

      // starts at the end of the sequence and works its way towards the front,
      // looking for two consecutive members of the sequence where the
      // difference between them is greater than one. For example , if the
      // sequence contains 1, 5, 8, 9 (total number is 10, first is 0 and the
      // last is 10 (due to STL's half open range)). At the end of while loop, j
      // will point to 5, and i will point to 8, next combination should be 1,
      // 6, 7, 8. If j is less than zero, it means it already reaches the last
      // combination of current size. For instance, sequence may contain 6, 7,
      // 8, 9 at this time, we need to increase the size of combination to 5
      typename std::vector<RandomAccessIterator>::iterator j = i;
      --j;
      while (j >= iterContainer.begin() && *i == *j + 1) {
        --i;
        --j;
      };

      RandomAccessIterator raIter;
      if (j - iterContainer.begin() <
          0) {  // reaches the last combination of current size
        // half open range
        if (last - first + 1 == int(iterContainer.size())) {
          // if the current size equals to total number, done
          return false;
        } else {
          // push the first currentSize+1 element into sequence

          for (i = iterContainer.begin(), raIter = first;
               i != iterContainer.end(); ++i, ++raIter) {
            *i = raIter;
          }
          iterContainer.insert(iterContainer.end(), raIter);

          return true;
        }

      } else {
        ++(*j);
        raIter = *j;
        for (; i != iterContainer.end(); ++i) {
          ++raIter;
          *i = raIter;
        }
        return true;
      }
    }
  }